

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O2

void spell_indomitable_spirit(int level,int sn,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  AFFECT_DATA af;
  
  bVar1 = is_affected(ch,(int)gsn_indomitable_spirit);
  if (bVar1) {
    send_to_char("You are already affected by an indomitable spirit.\n\r",ch);
    return;
  }
  act("You call upon your deity to raise your spirit.",ch,(void *)0x0,(void *)0x0,3);
  act("$n calls up on $s deity to raise his spirit.",ch,(void *)0x0,(void *)0x0,0);
  init_affect(&af);
  af.level = ch->level;
  af.type = gsn_indomitable_spirit;
  af.where = 0;
  af.aftype = 4;
  af.location = 0;
  af.modifier = 0;
  af.duration = af.level / 5;
  af.beat_fun = ispirit_beat;
  af.end_fun = ispirit_end;
  af.mod_name = 2;
  af.owner = ch;
  affect_to_char(ch,&af);
  return;
}

Assistant:

void spell_indomitable_spirit(int level, int sn, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *vict = (CHAR_DATA *)vo;

	if (is_affected(ch, gsn_indomitable_spirit))
	{
		send_to_char("You are already affected by an indomitable spirit.\n\r", ch);
		return;
	}

	act("You call upon your deity to raise your spirit.", ch, 0, 0, TO_CHAR);
	act("$n calls up on $s deity to raise his spirit.", ch, 0, 0, TO_ROOM);

	init_affect(&af);
	af.owner = ch;
	af.level = ch->level;
	af.type = gsn_indomitable_spirit;
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.duration = ch->level / 5;
	af.beat_fun = ispirit_beat;
	af.end_fun = ispirit_end;
	af.mod_name = MOD_TOUGHNESS;
	affect_to_char(ch, &af);
}